

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O0

void deqp::egl::anon_unknown_7::logConfigAttrib(TestLog *log,EGLenum attrib,EGLint value)

{
  char *__s;
  MessageBuilder *pMVar1;
  bool bVar2;
  ConfigAttribValueFmt local_360;
  MessageBuilder local_358;
  uint local_1d4;
  MessageBuilder local_1d0;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string attribStr;
  EGLint value_local;
  EGLenum attrib_local;
  TestLog *log_local;
  
  attribStr.field_2._8_4_ = value;
  attribStr.field_2._12_4_ = attrib;
  __s = eglu::getConfigAttribName(attrib);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,__s,&local_39);
  std::allocator<char>::~allocator(&local_39);
  bVar2 = attribStr.field_2._8_4_ != -1;
  if (bVar2) {
    tcu::TestLog::operator<<(&local_358,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<(&local_358,(char (*) [3])0x589fc6);
    pMVar1 = tcu::MessageBuilder::operator<<
                       (pMVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_38);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x5830bb);
    local_360 = eglu::getConfigAttribValueStr(attribStr.field_2._12_4_,attribStr.field_2._8_4_);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_360);
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_358);
  }
  else {
    tcu::TestLog::operator<<(&local_1d0,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<(&local_1d0,(char (*) [3])0x589fc6);
    pMVar1 = tcu::MessageBuilder::operator<<
                       (pMVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_38);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [16])": EGL_DONT_CARE");
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d0);
  }
  local_1d4 = (uint)!bVar2;
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void logConfigAttrib (TestLog& log, EGLenum attrib, EGLint value)
{
	const std::string	attribStr	= eglu::getConfigAttribName(attrib);

	if (value == EGL_DONT_CARE)
	{
		log << TestLog::Message << "  " << attribStr << ": EGL_DONT_CARE" << TestLog::EndMessage;
		return;
	}

	log << TestLog::Message << "  " << attribStr << ": " << eglu::getConfigAttribValueStr(attrib, value) << TestLog::EndMessage;
}